

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

int32 Js::JavascriptNumber::DirectPowIntInt(bool *isOverflow,int32 x,int32 y)

{
  bool bVar1;
  int32 local_30;
  int32 local_2c;
  int32 result;
  int32 x_local;
  
  if (-1 < y) {
    local_30 = 1;
    local_2c = x;
    do {
      if (((y & 1U) != 0) && (bVar1 = Int32Math::Mul(local_30,local_2c,&local_30), bVar1)) break;
      if ((uint)y < 2) {
        *isOverflow = false;
        return local_30;
      }
      y = (uint)y >> 1;
      bVar1 = Int32Math::Mul(local_2c,local_2c,&local_2c);
    } while (!bVar1);
  }
  *isOverflow = true;
  return 0;
}

Assistant:

int32 JavascriptNumber::DirectPowIntInt(bool* isOverflow, int32 x, int32 y)
    {
        if (y < 0)
        {
            *isOverflow = true;
            return 0;
        }

        uint32 uexp = static_cast<uint32>(y);
        int32 result = 1;

        while (true)
        {
            if ((uexp & 1) != 0)
            {
                if (Int32Math::Mul(result, x, &result))
                {
                    *isOverflow = true;
                    break;
                }
            }
            if ((uexp >>= 1) == 0)
            {
                *isOverflow = false;
                break;
            }
            if (Int32Math::Mul(x, x, &x))
            {
                *isOverflow = true;
                break;
            }
        }

        return *isOverflow ? 0 : result;
    }